

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O0

void aom_get_var_sse_sum_8x8_quad_c
               (uint8_t *a,int a_stride,uint8_t *b,int b_stride,uint32_t *sse8x8,int *sum8x8,
               uint *tot_sse,int *tot_sum,uint32_t *var8x8)

{
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int *in_R8;
  int *in_R9;
  int *in_stack_00000008;
  int i;
  int k;
  int local_38;
  int local_34;
  
  for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
    variance((uint8_t *)(in_RDI + (local_34 << 3)),in_ESI,(uint8_t *)(in_RDX + (local_34 << 3)),
             in_ECX,8,8,(uint32_t *)(in_R8 + local_34),in_R9 + local_34);
  }
  *in_stack_00000008 = *in_R8 + in_R8[1] + in_R8[2] + in_R8[3] + *in_stack_00000008;
  *_i = *in_R9 + in_R9[1] + in_R9[2] + in_R9[3] + *_i;
  for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
    sum8x8[local_38] = in_R8[local_38] - (int)((long)in_R9[local_38] * (long)in_R9[local_38] >> 6);
  }
  return;
}

Assistant:

void aom_get_var_sse_sum_8x8_quad_c(const uint8_t *a, int a_stride,
                                    const uint8_t *b, int b_stride,
                                    uint32_t *sse8x8, int *sum8x8,
                                    unsigned int *tot_sse, int *tot_sum,
                                    uint32_t *var8x8) {
  // Loop over 4 8x8 blocks. Process one 8x32 block.
  for (int k = 0; k < 4; k++) {
    variance(a + (k * 8), a_stride, b + (k * 8), b_stride, 8, 8, &sse8x8[k],
             &sum8x8[k]);
  }

  // Calculate variance at 8x8 level and total sse, sum of 8x32 block.
  *tot_sse += sse8x8[0] + sse8x8[1] + sse8x8[2] + sse8x8[3];
  *tot_sum += sum8x8[0] + sum8x8[1] + sum8x8[2] + sum8x8[3];
  for (int i = 0; i < 4; i++)
    var8x8[i] = sse8x8[i] - (uint32_t)(((int64_t)sum8x8[i] * sum8x8[i]) >> 6);
}